

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall dmlc::JSONWriter::WriteSeperator(JSONWriter *this)

{
  ostream *os;
  size_type sVar1;
  bool local_55;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  reference local_20;
  JSONWriter *local_10;
  JSONWriter *this_local;
  
  local_10 = this;
  sVar1 = std::vector<bool,_std::allocator<bool>_>::size(&this->scope_multi_line_);
  local_55 = true;
  if (sVar1 != 0) {
    local_20 = std::vector<bool,_std::allocator<bool>_>::back(&this->scope_multi_line_);
    local_55 = std::_Bit_reference::operator_cast_to_bool(&local_20);
  }
  if (local_55 != false) {
    anon_unknown_9::Extend<char>(this->os_,'\n');
    os = this->os_;
    sVar1 = std::vector<bool,_std::allocator<bool>_>::size(&this->scope_multi_line_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,sVar1 * 2,' ',&local_41);
    (anonymous_namespace)::Extend<std::__cxx11::string>(os,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return;
}

Assistant:

inline void JSONWriter::WriteSeperator() {
  if (scope_multi_line_.size() == 0 || scope_multi_line_.back()) {
    Extend(os_, '\n');
    Extend(os_, std::string(scope_multi_line_.size() * 2, ' '));
  }
}